

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_unres_schema_types
              (unres_schema *unres,UNRES_ITEM types,ly_ctx *ctx,int forward_ref,int print_all_errors
              ,uint32_t *resolved)

{
  UNRES_ITEM *pUVar1;
  int iVar2;
  LY_ERR *pLVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  LY_ERR local_54;
  ly_err_item *local_50;
  ly_err_item *prev_eitem;
  int_log_opts local_3c;
  int local_38;
  int_log_opts prev_ilo;
  
  prev_eitem = (ly_err_item *)ctx;
  prev_ilo = forward_ref;
  if (forward_ref != 0) {
    pLVar3 = ly_errno_glob_address();
    local_54 = *pLVar3;
    ly_ilo_change(ctx,ILO_STORE,&local_3c,&local_50);
  }
  local_38 = 0;
  do {
    if (unres->count == 0) {
      uVar6 = 0;
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      uVar5 = 0;
      uVar6 = 0;
      do {
        if ((unres->type[uVar4] & types) != 0) {
          iVar2 = resolve_unres_schema_item
                            (unres->module[uVar4],unres->item[uVar4],unres->type[uVar4],
                             unres->str_snode[uVar4],unres);
          pUVar1 = unres->type;
          if (pUVar1[uVar4] == UNRES_EXT_FINALIZE) {
            pUVar1[uVar4] = UNRES_RESOLVED;
          }
          uVar6 = uVar6 + 1;
          if ((iVar2 == 0) || (pUVar1[uVar4] == UNRES_XPATH)) {
            if (pUVar1[uVar4] == UNRES_LIST_UNIQ) {
              free(unres->item[uVar4]);
            }
            unres->type[uVar4] = UNRES_RESOLVED;
            *resolved = *resolved + 1;
            uVar5 = uVar5 + 1;
          }
          else if ((prev_ilo == ILO_LOG) || (iVar2 != 1)) {
            if (print_all_errors == 0) {
              if (prev_ilo == ILO_LOG) {
                return -1;
              }
              ly_ilo_restore((ly_ctx *)prev_eitem,local_3c,local_50,1);
              return -1;
            }
            uVar5 = uVar5 + 1;
            local_38 = -1;
          }
          else {
            ly_err_free_next((ly_ctx *)prev_eitem,local_50);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < unres->count);
    }
  } while ((uVar5 != 0) && (uVar5 < uVar6));
  if (uVar5 < uVar6) {
    if (prev_ilo == ILO_LOG) {
      __assert_fail("forward_ref",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x1cdd,
                    "int resolve_unres_schema_types(struct unres_schema *, enum UNRES_ITEM, struct ly_ctx *, int, int, uint32_t *)"
                   );
    }
    ly_ilo_restore((ly_ctx *)prev_eitem,local_3c,local_50,0);
    iVar2 = -1;
    if (unres->count != 0) {
      uVar4 = 0;
      do {
        if ((unres->type[uVar4] & types) != 0) {
          resolve_unres_schema_item
                    (unres->module[uVar4],unres->item[uVar4],unres->type[uVar4],
                     unres->str_snode[uVar4],unres);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < unres->count);
    }
  }
  else {
    iVar2 = local_38;
    if (prev_ilo != ILO_LOG) {
      ly_ilo_restore((ly_ctx *)prev_eitem,local_3c,local_50,0);
      pLVar3 = ly_errno_glob_address();
      *pLVar3 = local_54;
      iVar2 = local_38;
    }
  }
  return iVar2;
}

Assistant:

static int
resolve_unres_schema_types(struct unres_schema *unres, enum UNRES_ITEM types, struct ly_ctx *ctx, int forward_ref,
                           int print_all_errors, uint32_t *resolved)
{
    uint32_t i, unres_count, res_count;
    int ret = 0, rc;
    struct ly_err_item *prev_eitem;
    enum int_log_opts prev_ilo;
    LY_ERR prev_ly_errno;

    /* if there can be no forward references, every failure is final, so we can print it directly */
    if (forward_ref) {
        prev_ly_errno = ly_errno;
        ly_ilo_change(ctx, ILO_STORE, &prev_ilo, &prev_eitem);
    }

    do {
        unres_count = 0;
        res_count = 0;

        for (i = 0; i < unres->count; ++i) {
            /* UNRES_TYPE_LEAFREF must be resolved (for storing leafref target pointers);
             * if-features are resolved here to make sure that we will have all if-features for
             * later check of feature circular dependency */
            if (unres->type[i] & types) {
                ++unres_count;
                rc = resolve_unres_schema_item(unres->module[i], unres->item[i], unres->type[i], unres->str_snode[i], unres);
                if (unres->type[i] == UNRES_EXT_FINALIZE) {
                    /* to avoid double free */
                    unres->type[i] = UNRES_RESOLVED;
                }
                if (!rc || (unres->type[i] == UNRES_XPATH)) {
                    /* invalid XPath can never cause an error, only a warning */
                    if (unres->type[i] == UNRES_LIST_UNIQ) {
                        /* free the allocated structure */
                        free(unres->item[i]);
                    }

                    unres->type[i] = UNRES_RESOLVED;
                    ++(*resolved);
                    ++res_count;
                } else if ((rc == EXIT_FAILURE) && forward_ref) {
                    /* forward reference, erase errors */
                    ly_err_free_next(ctx, prev_eitem);
                } else if (print_all_errors) {
                    /* just so that we quit the loop */
                    ++res_count;
                    ret = -1;
                } else {
                    if (forward_ref) {
                        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 1);
                    }
                    return -1;
                }
            }
        }
    } while (res_count && (res_count < unres_count));

    if (res_count < unres_count) {
        assert(forward_ref);
        /* just print the errors (but we must free the ones we have and get them again :-/ ) */
        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 0);

        for (i = 0; i < unres->count; ++i) {
            if (unres->type[i] & types) {
                resolve_unres_schema_item(unres->module[i], unres->item[i], unres->type[i], unres->str_snode[i], unres);
            }
        }
        return -1;
    }

    if (forward_ref) {
        /* restore log */
        ly_ilo_restore(ctx, prev_ilo, prev_eitem, 0);
        ly_errno = prev_ly_errno;
    }

    return ret;
}